

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Money *m)

{
  long lVar1;
  pointer pcVar2;
  char *pcVar3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  lVar1 = m->cents;
  pcVar3 = "";
  if (lVar1 < 0) {
    pcVar3 = "-";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,-(lVar1 >> 0x3f));
  pcVar2 = (m->currency)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (m->currency)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::ostream::_M_insert<double>((double)lVar1 / *(double *)(&DAT_001040a0 + (lVar1 >> 0x3f) * -8))
  ;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Money& m)
{
	long c = m.get_cents();
	os << (c < 0 ? "-" : "")
		<< m.get_currency()
		<< (c < 0 ? c / (-100.0) : c / 100.0);
	return os;
}